

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoiseRefreshLine(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  uint uVar4;
  size_t sVar5;
  void *__dest;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  undefined8 local_98;
  undefined2 local_90;
  ulong local_58;
  char *local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  if (mlmode == 0) {
    local_50 = ls.prompt;
    sVar5 = strlen(ls.prompt);
    uVar8 = CONCAT44(ls.cols._4_4_,(int)ls.cols);
    uVar10 = CONCAT44(ls.pos._4_4_,(int)ls.pos) + sVar5;
    if (uVar10 < uVar8) {
      local_40 = ls.buf;
      sVar14 = ls.len;
      local_48 = uVar10;
    }
    else {
      local_48 = uVar8 - 1;
      if (uVar10 - 1 < uVar8 - 1) {
        local_48 = uVar10 - 1;
      }
      local_40 = ls.buf + (uVar10 - local_48);
      sVar14 = (ls.len - uVar10) + local_48;
    }
    local_58 = CONCAT44(local_58._4_4_,ls.ofd);
    uVar10 = sVar14 + sVar5;
    if (uVar8 < sVar14 + sVar5) {
      uVar10 = uVar8;
    }
    local_98 = CONCAT62(local_98._2_6_,0xd);
    sVar7 = strlen((char *)&local_98);
    iVar13 = (int)sVar7;
    __dest = malloc((long)iVar13);
    if (__dest == (void *)0x0) {
      iVar13 = 0;
    }
    else {
      memcpy(__dest,&local_98,(long)iVar13);
    }
    iVar12 = (int)sVar5;
    iVar11 = (int)uVar10 - iVar12;
    local_38 = (ulong)(uint)(iVar13 + iVar12);
    pvVar6 = realloc(__dest,(long)(iVar13 + iVar12));
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar13 + (long)pvVar6),local_50,(long)iVar12);
      iVar13 = (int)local_38;
      __dest = pvVar6;
    }
    iVar12 = iVar11 + iVar13;
    pvVar6 = realloc(__dest,(long)iVar12);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar13 + (long)pvVar6),local_40,(long)iVar11);
      __dest = pvVar6;
      iVar13 = iVar12;
    }
    local_98._4_4_ = (uint)((ulong)local_98 >> 0x20) & 0xffffff00;
    local_98 = CONCAT44(local_98._4_4_,0x4b305b1b);
    sVar7 = strlen((char *)&local_98);
    uVar4 = (int)sVar7 + iVar13;
    local_40 = (char *)(ulong)uVar4;
    pvVar6 = realloc(__dest,(long)(int)uVar4);
    sVar5 = (size_t)iVar13;
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)(sVar5 + (long)pvVar6),&local_98,(long)(int)sVar7);
      iVar13 = (int)local_40;
      __dest = pvVar6;
      sVar5 = (long)(int)uVar4;
    }
    snprintf((char *)&local_98,0x40,"\r\x1b[%dC",local_48);
    sVar7 = strlen((char *)&local_98);
    sVar9 = (size_t)((int)sVar7 + iVar13);
    pvVar6 = realloc(__dest,sVar9);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)(sVar5 + (long)pvVar6),&local_98,(long)(int)sVar7);
      __dest = pvVar6;
      sVar5 = sVar9;
    }
    write((int)local_58,__dest,sVar5);
    goto LAB_0010b228;
  }
  local_40 = (char *)strlen(ls.prompt);
  local_50 = (char *)(long)(int)local_40;
  uVar8 = CONCAT44(ls.cols._4_4_,(int)ls.cols);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_50 + ls.len + uVar8 + -1;
  local_38 = SUB168(auVar2 / auVar1,0);
  iVar13 = (int)ls.maxrows;
  iVar11 = SUB164(auVar2 / auVar1,0);
  if ((int)ls.maxrows < iVar11) {
    ls.maxrows = (size_t)iVar11;
  }
  local_48 = CONCAT44(local_48._4_4_,ls.ofd);
  if ((int)((ulong)(local_50 + ls.oldpos + uVar8) / uVar8) < iVar13) {
    snprintf((char *)&local_98,0x40,"\x1b[%dB");
    sVar5 = strlen((char *)&local_98);
    __dest = malloc((long)(int)sVar5);
    if (__dest == (void *)0x0) goto LAB_0010ad9b;
    memcpy(__dest,&local_98,(long)(int)sVar5);
    uVar8 = sVar5 & 0xffffffff;
  }
  else {
LAB_0010ad9b:
    uVar8 = 0;
    __dest = (void *)0x0;
  }
  iVar11 = (int)uVar8;
  if (1 < iVar13) {
    iVar13 = iVar13 + -1;
    do {
      local_98 = 0x315b1b4b305b1b0d;
      local_90 = 0x41;
      sVar5 = strlen((char *)&local_98);
      uVar4 = (int)sVar5 + (int)uVar8;
      local_58 = (ulong)uVar4;
      pvVar6 = realloc(__dest,(long)(int)uVar4);
      if (pvVar6 != (void *)0x0) {
        memcpy((void *)((long)(int)uVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
        __dest = pvVar6;
        uVar8 = local_58;
      }
      iVar11 = (int)uVar8;
      uVar8 = uVar8 & 0xffffffff;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  local_98 = CONCAT26(local_98._6_2_,0x4b00000000);
  local_98 = CONCAT44(local_98._4_4_,0x305b1b0d);
  sVar5 = strlen((char *)&local_98);
  iVar13 = (int)sVar5 + iVar11;
  pvVar6 = realloc(__dest,(long)iVar13);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar11 + (long)pvVar6),&local_98,(long)(int)sVar5);
    __dest = pvVar6;
    iVar11 = iVar13;
  }
  pcVar3 = ls.prompt;
  sVar5 = strlen(ls.prompt);
  iVar13 = (int)sVar5 + iVar11;
  pvVar6 = realloc(__dest,(long)iVar13);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar11 + (long)pvVar6),pcVar3,(long)(int)sVar5);
    __dest = pvVar6;
    iVar11 = iVar13;
  }
  pcVar3 = ls.buf;
  iVar13 = (int)ls.len;
  iVar12 = iVar13 + iVar11;
  pvVar6 = realloc(__dest,(long)iVar12);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar11 + (long)pvVar6),pcVar3,(long)iVar13);
    __dest = pvVar6;
    iVar11 = iVar12;
  }
  pcVar3 = local_50;
  sVar14 = CONCAT44(ls.pos._4_4_,(int)ls.pos);
  if (((sVar14 == 0) || (sVar14 != ls.len)) ||
     ((ulong)(local_50 + sVar14) % CONCAT44(ls.cols._4_4_,(int)ls.cols) != 0)) {
    iVar13 = (int)local_38;
  }
  else {
    pvVar6 = realloc(__dest,(long)(iVar11 + 1));
    if (pvVar6 != (void *)0x0) {
      *(undefined1 *)((long)pvVar6 + (long)iVar11) = 10;
      __dest = pvVar6;
      iVar11 = iVar11 + 1;
    }
    local_98 = CONCAT62(local_98._2_6_,0xd);
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar11;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar11 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar11 = iVar13;
    }
    iVar13 = (int)local_38 + 1;
    if ((int)ls.maxrows <= (int)local_38) {
      ls.maxrows = (size_t)iVar13;
    }
  }
  if ((int)((ulong)(pcVar3 + CONCAT44(ls.cols._4_4_,(int)ls.cols) +
                             CONCAT44(ls.pos._4_4_,(int)ls.pos)) /
           CONCAT44(ls.cols._4_4_,(int)ls.cols)) < iVar13) {
    snprintf((char *)&local_98,0x40,"\x1b[%dA");
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar11;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar11 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar11 = iVar13;
    }
  }
  uVar8 = (long)((int)local_40 + (int)ls.pos) % (long)(int)ls.cols;
  if ((int)uVar8 == 0) {
    local_98 = CONCAT62(local_98._2_6_,0xd);
  }
  else {
    snprintf((char *)&local_98,0x40,"\r\x1b[%dC",uVar8 & 0xffffffff);
  }
  sVar7 = strlen((char *)&local_98);
  sVar9 = (size_t)((int)sVar7 + iVar11);
  pvVar6 = realloc(__dest,sVar9);
  sVar5 = (size_t)iVar11;
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)(sVar5 + (long)pvVar6),&local_98,(long)(int)sVar7);
    sVar5 = sVar9;
    __dest = pvVar6;
  }
  ls.oldpos = CONCAT44(ls.pos._4_4_,(int)ls.pos);
  write((int)local_48,__dest,sVar5);
LAB_0010b228:
  free(__dest);
  return;
}

Assistant:

void linenoiseRefreshLine(void) {
    if (mlmode)
        refreshMultiLine(&ls);
    else
        refreshSingleLine(&ls);
}